

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O1

int chacha_test(uint8_t *input_buffer)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  undefined1 auVar7 [16];
  undefined1 auVar23 [16];
  chacha_iv iv;
  chacha_key key;
  uint8_t h_iv [16];
  uint8_t h_key [32];
  uint8_t final_hchacha [32];
  uint8_t out [2056];
  chacha_iv local_8b8;
  chacha_key local_8b0;
  uint8_t *local_890;
  uint8_t local_888 [16];
  byte local_878 [32];
  uint8_t local_858 [33];
  uint8_t local_837 [2055];
  
  bVar6 = 0;
  bVar8 = 1;
  bVar9 = 2;
  bVar10 = 3;
  bVar11 = 4;
  bVar12 = 5;
  bVar13 = 6;
  bVar14 = 7;
  bVar15 = 8;
  bVar16 = 9;
  bVar17 = 10;
  bVar18 = 0xb;
  bVar19 = 0xc;
  bVar20 = 0xd;
  bVar21 = 0xe;
  bVar22 = 0xf;
  lVar5 = 0;
  do {
    local_8b0.b[lVar5] = bVar6 | 0x20;
    local_8b0.b[lVar5 + 1] = bVar8 | 0x20;
    local_8b0.b[lVar5 + 2] = bVar9 | 0x20;
    local_8b0.b[lVar5 + 3] = bVar10 | 0x20;
    local_8b0.b[lVar5 + 4] = bVar11 | 0x20;
    local_8b0.b[lVar5 + 5] = bVar12 | 0x20;
    local_8b0.b[lVar5 + 6] = bVar13 | 0x20;
    local_8b0.b[lVar5 + 7] = bVar14 | 0x20;
    local_8b0.b[lVar5 + 8] = bVar15 | 0x20;
    local_8b0.b[lVar5 + 9] = bVar16 | 0x20;
    local_8b0.b[lVar5 + 10] = bVar17 | 0x20;
    local_8b0.b[lVar5 + 0xb] = bVar18 | 0x20;
    local_8b0.b[lVar5 + 0xc] = bVar19 | 0x20;
    local_8b0.b[lVar5 + 0xd] = bVar20 | 0x20;
    local_8b0.b[lVar5 + 0xe] = bVar21 | 0x20;
    local_8b0.b[lVar5 + 0xf] = bVar22 | 0x20;
    lVar5 = lVar5 + 0x10;
    bVar6 = bVar6 + 0x10;
    bVar8 = bVar8 + 0x10;
    bVar9 = bVar9 + 0x10;
    bVar10 = bVar10 + 0x10;
    bVar11 = bVar11 + 0x10;
    bVar12 = bVar12 + 0x10;
    bVar13 = bVar13 + 0x10;
    bVar14 = bVar14 + 0x10;
    bVar15 = bVar15 + 0x10;
    bVar16 = bVar16 + 0x10;
    bVar17 = bVar17 + 0x10;
    bVar18 = bVar18 + 0x10;
    bVar19 = bVar19 + 0x10;
    bVar20 = bVar20 + 0x10;
    bVar21 = bVar21 + 0x10;
    bVar22 = bVar22 + 0x10;
  } while (lVar5 != 0x20);
  local_8b8.b[0] = 0x80;
  local_8b8.b[1] = 0x81;
  local_8b8.b[2] = 0x82;
  local_8b8.b[3] = 0x83;
  local_8b8.b[4] = 0x84;
  local_8b8.b[5] = 0x85;
  local_8b8.b[6] = 0x86;
  local_8b8.b[7] = 0x87;
  puVar1 = input_buffer + 1;
  uVar2 = chacha_test_oneblock(&local_8b0,&local_8b8,input_buffer,local_858 + 0x20);
  uVar3 = chacha_test_oneblock(&local_8b0,&local_8b8,input_buffer,local_837);
  uVar3 = uVar3 & uVar2;
  if (input_buffer == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)0x0;
  }
  else {
    uVar2 = chacha_test_oneblock(&local_8b0,&local_8b8,puVar1,local_858 + 0x20);
    uVar4 = chacha_test_oneblock(&local_8b0,&local_8b8,puVar1,local_837);
    uVar3 = uVar3 & uVar4 & uVar2;
  }
  uVar2 = chacha_test_multiblock(&local_8b0,&local_8b8,input_buffer,local_858 + 0x20);
  uVar4 = chacha_test_multiblock(&local_8b0,&local_8b8,input_buffer,local_837);
  uVar3 = uVar4 & uVar2 & uVar3;
  local_890 = puVar1;
  if (input_buffer != (uint8_t *)0x0) {
    uVar2 = chacha_test_multiblock(&local_8b0,&local_8b8,puVar1,local_858 + 0x20);
    uVar4 = chacha_test_multiblock(&local_8b0,&local_8b8,puVar1,local_837);
    uVar3 = uVar3 & uVar4 & uVar2;
  }
  uVar2 = chacha_test_multiblock_incremental(&local_8b0,&local_8b8,input_buffer,local_858 + 0x20);
  uVar4 = chacha_test_multiblock_incremental(&local_8b0,&local_8b8,input_buffer,local_837);
  puVar1 = local_890;
  uVar3 = uVar4 & uVar2 & uVar3;
  if (input_buffer != (uint8_t *)0x0) {
    uVar2 = chacha_test_multiblock_incremental(&local_8b0,&local_8b8,local_890,local_858 + 0x20);
    uVar4 = chacha_test_multiblock_incremental(&local_8b0,&local_8b8,puVar1,local_837);
    uVar3 = uVar3 & uVar4 & uVar2;
  }
  bVar6 = 0;
  bVar8 = 1;
  bVar9 = 2;
  bVar10 = 3;
  bVar11 = 4;
  bVar12 = 5;
  bVar13 = 6;
  bVar14 = 7;
  bVar15 = 8;
  bVar16 = 9;
  bVar17 = 10;
  bVar18 = 0xb;
  bVar19 = 0xc;
  bVar20 = 0xd;
  bVar21 = 0xe;
  bVar22 = 0xf;
  lVar5 = 0;
  do {
    local_878[lVar5] = bVar6 | 0xc0;
    local_878[lVar5 + 1] = bVar8 | 0xc0;
    local_878[lVar5 + 2] = bVar9 | 0xc0;
    local_878[lVar5 + 3] = bVar10 | 0xc0;
    local_878[lVar5 + 4] = bVar11 | 0xc0;
    local_878[lVar5 + 5] = bVar12 | 0xc0;
    local_878[lVar5 + 6] = bVar13 | 0xc0;
    local_878[lVar5 + 7] = bVar14 | 0xc0;
    local_878[lVar5 + 8] = bVar15 | 0xc0;
    local_878[lVar5 + 9] = bVar16 | 0xc0;
    local_878[lVar5 + 10] = bVar17 | 0xc0;
    local_878[lVar5 + 0xb] = bVar18 | 0xc0;
    local_878[lVar5 + 0xc] = bVar19 | 0xc0;
    local_878[lVar5 + 0xd] = bVar20 | 0xc0;
    local_878[lVar5 + 0xe] = bVar21 | 0xc0;
    local_878[lVar5 + 0xf] = bVar22 | 0xc0;
    lVar5 = lVar5 + 0x10;
    bVar6 = bVar6 + 0x10;
    bVar8 = bVar8 + 0x10;
    bVar9 = bVar9 + 0x10;
    bVar10 = bVar10 + 0x10;
    bVar11 = bVar11 + 0x10;
    bVar12 = bVar12 + 0x10;
    bVar13 = bVar13 + 0x10;
    bVar14 = bVar14 + 0x10;
    bVar15 = bVar15 + 0x10;
    bVar16 = bVar16 + 0x10;
    bVar17 = bVar17 + 0x10;
    bVar18 = bVar18 + 0x10;
    bVar19 = bVar19 + 0x10;
    bVar20 = bVar20 + 0x10;
    bVar21 = bVar21 + 0x10;
    bVar22 = bVar22 + 0x10;
  } while (lVar5 != 0x20);
  builtin_memcpy(local_888,"\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f",0x10);
  local_858[0] = '\0';
  local_858[1] = '\0';
  local_858[2] = '\0';
  local_858[3] = '\0';
  local_858[4] = '\0';
  local_858[5] = '\0';
  local_858[6] = '\0';
  local_858[7] = '\0';
  local_858[8] = '\0';
  local_858[9] = '\0';
  local_858[10] = '\0';
  local_858[0xb] = '\0';
  local_858[0xc] = '\0';
  local_858[0xd] = '\0';
  local_858[0xe] = '\0';
  local_858[0xf] = '\0';
  local_858[0x10] = '\0';
  local_858[0x11] = '\0';
  local_858[0x12] = '\0';
  local_858[0x13] = '\0';
  local_858[0x14] = '\0';
  local_858[0x15] = '\0';
  local_858[0x16] = '\0';
  local_858[0x17] = '\0';
  local_858[0x18] = '\0';
  local_858[0x19] = '\0';
  local_858[0x1a] = '\0';
  local_858[0x1b] = '\0';
  local_858[0x1c] = '\0';
  local_858[0x1d] = '\0';
  local_858[0x1e] = '\0';
  local_858[0x1f] = '\0';
  hchacha_ref(local_878,local_888,local_858,8);
  auVar23[0] = -(local_858[0x10] == '{');
  auVar23[1] = -(local_858[0x11] == -0x57);
  auVar23[2] = -(local_858[0x12] == '6');
  auVar23[3] = -(local_858[0x13] == -0xd);
  auVar23[4] = -(local_858[0x14] == 'c');
  auVar23[5] = -(local_858[0x15] == '/');
  auVar23[6] = -(local_858[0x16] == '\\');
  auVar23[7] = -(local_858[0x17] == 'm');
  auVar23[8] = -(local_858[0x18] == '@');
  auVar23[9] = -(local_858[0x19] == '9');
  auVar23[10] = -(local_858[0x1a] == '$');
  auVar23[0xb] = -(local_858[0x1b] == -0x4d);
  auVar23[0xc] = -(local_858[0x1c] == 't');
  auVar23[0xd] = -(local_858[0x1d] == 'h');
  auVar23[0xe] = -(local_858[0x1e] == -0x35);
  auVar23[0xf] = -(local_858[0x1f] == -0x23);
  auVar7[0] = -(local_858[0] == 0xe6);
  auVar7[1] = -(local_858[1] == '\x19');
  auVar7[2] = -(local_858[2] == '\x0f');
  auVar7[3] = -(local_858[3] == 'H');
  auVar7[4] = -(local_858[4] == -0xf);
  auVar7[5] = -(local_858[5] == -0x40);
  auVar7[6] = -(local_858[6] == '*');
  auVar7[7] = -(local_858[7] == 'h');
  auVar7[8] = -(local_858[8] == -0x48);
  auVar7[9] = -(local_858[9] == -0xe);
  auVar7[10] = -(local_858[10] == '.');
  auVar7[0xb] = -(local_858[0xb] == -8);
  auVar7[0xc] = -(local_858[0xc] == -0x44);
  auVar7[0xd] = -(local_858[0xd] == -3);
  auVar7[0xe] = -(local_858[0xe] == 'A');
  auVar7[0xf] = -(local_858[0xf] == '\x06');
  auVar7 = auVar7 & auVar23;
  return (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff & uVar3;
}

Assistant:

static int
chacha_test(const uint8_t *input_buffer) {
    chacha_key key;
    chacha_iv iv;
    uint8_t h_key[32];
    uint8_t h_iv[16];
    uint8_t out[CHACHA_TEST_LEN+sizeof(size_t)], final_hchacha[32];
    const uint8_t *in_aligned, *in_unaligned;
    uint8_t *out_aligned, *out_unaligned;
    size_t i;
    int res = 1;

    /*
        key [32,33,34,..63], iv [128,129,130,131,132,133,134,135]
    */
    for (i = 0; i < sizeof(key); i++) key.b[i] = (uint8_t)(i + 32);
    for (i = 0; i < sizeof(iv); i++) iv.b[i] = (uint8_t)(i + 128);

    in_aligned = input_buffer;
    in_unaligned = (input_buffer) ? (input_buffer + 1) : NULL;
    out_aligned = out;
    out_unaligned = out + 1;

    /* single block */
    res &= chacha_test_oneblock(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_oneblock(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_oneblock(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_oneblock(&key, &iv, in_unaligned, out_unaligned);
    }

    /* multi */
    res &= chacha_test_multiblock(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_multiblock(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_multiblock(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_multiblock(&key, &iv, in_unaligned, out_unaligned);
    }

    /* incremental */
    res &= chacha_test_multiblock_incremental(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_multiblock_incremental(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_multiblock_incremental(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_multiblock_incremental(&key, &iv, in_unaligned, out_unaligned);
    }

    /*
        hchacha
        key [192,193,194,..223], iv [16,17,18,..31]
    */
    for (i = 0; i < sizeof(h_key); i++) h_key[i] = (uint8_t)(i + 192);
    for (i = 0; i < sizeof(h_iv); i++) h_iv[i] = (uint8_t)(i + 16);

    memset(final_hchacha, 0, sizeof(final_hchacha));
    hchacha(h_key, h_iv, final_hchacha, chacha_test_rounds);
    res &= (memcmp(expected_hchacha, final_hchacha, sizeof(expected_hchacha)) == 0) ? 1 : 0;

    return res;
}